

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,ostream *out)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TPZGeoNode *pTVar4;
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Geo Element - fId ",0x12);
  poVar3 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t Type ",7);
  builtin_strncpy(local_38,"QuadTorus",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_38,9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  pzgeom::TPZNodeRep<4,_pztopology::TPZQuadrilateral>::Print
            ((TPZNodeRep<4,_pztopology::TPZQuadrilateral> *)&this->fGeo,out);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      pTVar4 = TPZGeoEl::NodePtr(&this->super_TPZGeoEl,iVar1);
      poVar3 = (ostream *)std::ostream::operator<<(out,pTVar4->fId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      iVar1 = iVar1 + 1;
      iVar2 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}